

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filescan.cc
# Opt level: O0

RC __thiscall RM_FileScan::GetNextRec(RM_FileScan *this,RM_Record *rec)

{
  bool bVar1;
  char *pcStack_60;
  bool satisfies;
  char *pData;
  RID rid;
  undefined1 local_40 [8];
  RM_Record temprec;
  RC rc;
  RM_Record *rec_local;
  RM_FileScan *this_local;
  
  if ((this->scanEnded & 1U) == 1) {
    this_local._4_4_ = 0x6e;
  }
  else if ((this->openScan & 1U) == 0) {
    this_local._4_4_ = 0x6c;
  }
  else {
    this->hasPagePinned = true;
    do {
      RM_Record::RM_Record((RM_Record *)local_40);
      temprec._20_4_ =
           RM_FileHandle::GetNextRecord
                     (this->fileHandle,this->scanPage,this->scanSlot,(RM_Record *)local_40,
                      &this->currentPH,(bool)(this->useNextPage & 1));
      if (temprec._20_4_ == 0) {
        this->hasPagePinned = true;
        if ((this->useNextPage & 1U) != 0) {
          GetNumRecOnPage(this,&this->currentPH,&this->numRecOnPage);
          this->useNextPage = false;
          this->numSeenOnPage = 0;
          if (this->numRecOnPage == 1) {
            PF_PageHandle::GetPageNum(&this->currentPH,&this->scanPage);
          }
        }
        this->numSeenOnPage = this->numSeenOnPage + 1;
        if (this->numRecOnPage == this->numSeenOnPage) {
          this->useNextPage = true;
          temprec._20_4_ = PF_FileHandle::UnpinPage(&this->fileHandle->pfh,this->scanPage);
          if (temprec._20_4_ != 0) {
            rid.page = 1;
            this_local._4_4_ = temprec._20_4_;
            goto LAB_00133c9d;
          }
          this->hasPagePinned = false;
          temprec._20_4_ = 0;
        }
        RID::RID((RID *)&pData);
        RM_Record::GetRid((RM_Record *)local_40,(RID *)&pData);
        RID::GetPageNum((RID *)&pData,&this->scanPage);
        RID::GetSlotNum((RID *)&pData,&this->scanSlot);
        temprec._20_4_ = RM_Record::GetData((RM_Record *)local_40,&stack0xffffffffffffffa0);
        if (temprec._20_4_ == 0) {
          if (this->compOp == NO_OP) {
            RM_Record::operator=(rec,(RM_Record *)local_40);
            rid.page = 3;
          }
          else {
            bVar1 = (*this->comparator)(pcStack_60 + this->attrOffset,this->value,this->attrType,
                                        this->attrLength);
            if (bVar1) {
              RM_Record::operator=(rec,(RM_Record *)local_40);
              rid.page = 3;
            }
            else {
              rid.page = 0;
            }
          }
        }
        else {
          rid.page = 1;
          this_local._4_4_ = temprec._20_4_;
        }
        RID::~RID((RID *)&pData);
      }
      else {
        if (temprec._20_4_ == 0x6e) {
          this->hasPagePinned = false;
          this->scanEnded = true;
        }
        rid.page = 1;
        this_local._4_4_ = temprec._20_4_;
      }
LAB_00133c9d:
      RM_Record::~RM_Record((RM_Record *)local_40);
    } while (rid.page == 0);
    if (rid.page != 1) {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

RC RM_FileScan::GetNextRec(RM_Record &rec) {
  // If the scan has ended, or is not valid, return immediately
  if(scanEnded == true)
    return (RM_EOF);
  if(openScan == false)
    return (RM_INVALIDSCAN);
  hasPagePinned = true;
  
  RC rc;
  while(true){
    // Retrieve next record
    RM_Record temprec;
    if((rc=fileHandle->GetNextRecord(scanPage, scanSlot, temprec, currentPH, useNextPage))){
      if(rc == RM_EOF){
        hasPagePinned = false;
        scanEnded = true;
      }
      return (rc);
    }
    hasPagePinned = true;
    // If we retrieved a record on the next page, reset numRecOnPage to
    // reflect the number of records seen on this new current page
    if(useNextPage){
      GetNumRecOnPage(currentPH, numRecOnPage);
      useNextPage = false;
      numSeenOnPage = 0;
      if(numRecOnPage == 1)
        currentPH.GetPageNum(scanPage);
    }
    numSeenOnPage++; // update # of records seen on this page

    // If we've seen all the record on this page, then next time, we 
    // need to look on the next page, not this page, so unpin the page
    // and set the indicator (useNextPage)
    if(numRecOnPage == numSeenOnPage){
      useNextPage = true;
      //printf("unpin page in filescan\n");
      if(rc = fileHandle->pfh.UnpinPage(scanPage)){
        return (rc);
      }
      hasPagePinned = false;
    }
   
    // Retrieves the RID of the scan to update the progress of the scan
    RID rid;
    temprec.GetRid(rid);
    rid.GetPageNum(scanPage);
    rid.GetSlotNum(scanSlot);

    // Check to see if it satisfies the scan comparison, and if it does,
    // exit the function, returning the record.
    char *pData;
    if((rc = temprec.GetData(pData))){
      return (rc);
    }
    if(compOp != NO_OP){
      bool satisfies = (* comparator)(pData + attrOffset, this->value, attrType, attrLength);
      if(satisfies){
        rec = temprec;
        break;
      }
    }
    else{
      rec = temprec; // if no comparison, just return the record
      break;
    }
  }
  return (0);
}